

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall
gss::innards::Proof::create_distance3_graphs
          (Proof *this,int g,NamedVertex *p,NamedVertex *q,NamedVertex *path_from_p_to_q_1,
          NamedVertex *path_from_p_to_q_2,NamedVertex *t,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *d1_from_t,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *d2_from_t,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *d3_from_t)

{
  long *plVar1;
  pointer ppVar2;
  unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
  uVar3;
  NamedVertex *pNVar4;
  ostream *poVar5;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var6;
  mapped_type *pmVar7;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *u_4;
  pointer ppVar8;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *u_2;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *u;
  key_type local_70;
  int local_4c;
  NamedVertex *local_48;
  tuple<int,_int,_int,_int> local_40;
  
  local_4c = g;
  poVar5 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t,"* adjacency ");
  poVar5 = std::operator<<(poVar5,(string *)&p->second);
  poVar5 = std::operator<<(poVar5," maps to ");
  poVar5 = std::operator<<(poVar5,(string *)&t->second);
  poVar5 = std::operator<<(poVar5," in G^3 so using path ");
  local_48 = path_from_p_to_q_1;
  poVar5 = std::operator<<(poVar5,(string *)&path_from_p_to_q_1->second);
  poVar5 = std::operator<<(poVar5," -- ");
  poVar5 = std::operator<<(poVar5,(string *)&path_from_p_to_q_2->second);
  poVar5 = std::operator<<(poVar5,", ");
  poVar5 = std::operator<<(poVar5,(string *)&q->second);
  std::operator<<(poVar5," maps to one of...\n");
  pNVar4 = local_48;
  _Var6._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  if ((_Var6._M_head_impl)->recover_encoding == true) {
    recover_adjacency_lines(this,0,p->first,local_48->first,t->first);
    ppVar2 = (d1_from_t->
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar8 = (d1_from_t->
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar2; ppVar8 = ppVar8 + 1)
    {
      recover_adjacency_lines(this,0,pNVar4->first,path_from_p_to_q_2->first,ppVar8->first);
    }
    ppVar2 = (d2_from_t->
             super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar8 = (d2_from_t->
                  super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; ppVar8 != ppVar2; ppVar8 = ppVar8 + 1)
    {
      recover_adjacency_lines(this,0,path_from_p_to_q_2->first,q->first,ppVar8->first);
    }
    _Var6._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  }
  std::operator<<((ostream *)
                  ((_Var6._M_head_impl)->proof_stream)._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ,"# 1\n");
  std::operator<<((ostream *)
                  (((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  proof_stream)._M_t,"p");
  poVar5 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t," ");
  pNVar4 = local_48;
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)(long)t->first;
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl = (long)p->first;
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)local_48->first;
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
  _M_head_impl = 0;
  std::
  map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator[](&((this->_imp)._M_t.
                 super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                 .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                adjacency_lines,&local_70);
  std::ostream::_M_insert<long>((long)poVar5);
  ppVar2 = (d1_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (d1_from_t->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t, ppVar8 != ppVar2; ppVar8 = ppVar8 + 1) {
    poVar5 = std::operator<<((ostream *)
                             uVar3._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl," ");
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl =
         (_Head_base<3UL,_long,_false>)(long)ppVar8->first;
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         (long)path_from_p_to_q_2->first;
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Head_base<1UL,_long,_false>._M_head_impl = (long)pNVar4->first;
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
    _M_head_impl = 0;
    std::
    map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[](&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  adjacency_lines,&local_70);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::operator<<(poVar5," +");
  }
  std::operator<<((ostream *)
                  uVar3._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                  ._M_head_impl," 0\n");
  _Var6._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var6._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  poVar5 = std::operator<<((ostream *)((_Var6._M_head_impl)->proof_stream)._M_t,"ia 1 ~x");
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)(long)p->first;
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)t->first;
  pmVar7 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,(key_type *)&local_70);
  std::operator<<(poVar5,(string *)pmVar7);
  ppVar2 = (d2_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (d2_from_t->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t, ppVar8 != ppVar2; ppVar8 = ppVar8 + 1) {
    poVar5 = std::operator<<((ostream *)
                             uVar3._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl," 1 x");
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl =
         (_Head_base<3UL,_long,_false>)(long)path_from_p_to_q_2->first;
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         (long)ppVar8->first;
    pmVar7 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)&local_70);
    std::operator<<(poVar5,(string *)pmVar7);
  }
  poVar5 = std::operator<<((ostream *)
                           uVar3._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl," >= 1 ; ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::operator<<(poVar5,'\n');
  _Var6._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var6._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  poVar5 = std::operator<<((ostream *)((_Var6._M_head_impl)->proof_stream)._M_t,"p ");
  std::ostream::_M_insert<long>((long)poVar5);
  ppVar2 = (d2_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (d2_from_t->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t, ppVar8 != ppVar2; ppVar8 = ppVar8 + 1) {
    poVar5 = std::operator<<((ostream *)
                             uVar3._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl," ");
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl =
         (_Head_base<3UL,_long,_false>)(long)ppVar8->first;
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Head_base<1UL,_long,_false>._M_head_impl = (long)path_from_p_to_q_2->first;
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         (long)q->first;
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Head_base<0UL,_long,_false>.
    _M_head_impl = 0;
    std::
    map<std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::tuple<long,_long,_long,_long>_>,_std::allocator<std::pair<const_std::tuple<long,_long,_long,_long>,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator[](&((this->_imp)._M_t.
                   super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                   .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  adjacency_lines,&local_70);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::operator<<(poVar5," s +");
  }
  std::operator<<((ostream *)
                  uVar3._M_t.
                  super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                  .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                  ._M_head_impl," 0\n");
  _Var6._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var6._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  std::operator<<((ostream *)((_Var6._M_head_impl)->proof_stream)._M_t,"# 0\n");
  poVar5 = std::operator<<((ostream *)
                           (((this->_imp)._M_t.
                             super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                             .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->proof_stream)._M_t,"ia 1 ~x");
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)(long)p->first;
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (long)t->first;
  pmVar7 = std::
           map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&((this->_imp)._M_t.
                          super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                          .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                         variable_mappings,(key_type *)&local_70);
  std::operator<<(poVar5,(string *)pmVar7);
  ppVar2 = (d3_from_t->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar8 = (d3_from_t->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar3._M_t.
      super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
      .super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>.
      _M_head_impl = (((this->_imp)._M_t.
                       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                     proof_stream)._M_t, ppVar8 != ppVar2; ppVar8 = ppVar8 + 1) {
    poVar5 = std::operator<<((ostream *)
                             uVar3._M_t.
                             super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                             ._M_head_impl," 1 x");
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.
    super__Head_base<3UL,_long,_false>._M_head_impl = (_Head_base<3UL,_long,_false>)(long)q->first;
    local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>
    .super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
         (long)ppVar8->first;
    pmVar7 = std::
             map<std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<const_std::pair<long,_long>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&((this->_imp)._M_t.
                            super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                            .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)
                           ->variable_mappings,(key_type *)&local_70);
    std::operator<<(poVar5,(string *)pmVar7);
  }
  poVar5 = std::operator<<((ostream *)
                           uVar3._M_t.
                           super___uniq_ptr_impl<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::basic_ostream<char,_std::char_traits<char>_>_*,_false>
                           ._M_head_impl," >= 1 ; ");
  poVar5 = std::ostream::_M_insert<long>((long)poVar5);
  std::operator<<(poVar5,'\n');
  _Var6._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl =
       (_Var6._M_head_impl)->proof_line + 1;
  (_Var6._M_head_impl)->proof_line =
       local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
       super__Head_base<2UL,_long,_false>._M_head_impl;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int>.super__Tuple_impl<3UL,_int>.super__Head_base<3UL,_int,_false>.
  _M_head_impl = (_Head_base<3UL,_int,_false>)t->first;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int>.super__Head_base<2UL,_int,_false>._M_head_impl = q->first;
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = p->first;
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long>.super__Tuple_impl<3UL,_long>.super__Head_base<3UL,_long,_false>
  ._M_head_impl = (_Head_base<3UL,_long,_false>)((long)"with expansion:\n\t" + 0x11);
  local_40.super__Tuple_impl<0UL,_int,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
       = local_4c;
  local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.super__Tuple_impl<1UL,_long,_long,_long>.
  super__Head_base<1UL,_long,_false>._M_head_impl =
       local_70.super__Tuple_impl<0UL,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_long,_long,_long>.super__Tuple_impl<2UL,_long,_long>.
       super__Head_base<2UL,_long,_false>._M_head_impl;
  std::
  _Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
  ::_M_emplace_unique<std::tuple<int,int,int,int>,std::tuple<long,long,char_const*>>
            ((_Rb_tree<std::tuple<long,long,long,long>,std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>,std::_Select1st<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>,std::less<std::tuple<long,long,long,long>>,std::allocator<std::pair<std::tuple<long,long,long,long>const,std::tuple<long,long,std::__cxx11::string>>>>
              *)&(_Var6._M_head_impl)->adjacency_lines,&local_40,
             (tuple<long,_long,_const_char_*> *)&local_70);
  return;
}

Assistant:

auto Proof::create_distance3_graphs(
    int g,
    const NamedVertex & p,
    const NamedVertex & q,
    const NamedVertex & path_from_p_to_q_1,
    const NamedVertex & path_from_p_to_q_2,
    const NamedVertex & t,
    const vector<NamedVertex> & d1_from_t,
    const vector<NamedVertex> & d2_from_t,
    const vector<NamedVertex> & d3_from_t) -> void
{
    *_imp->proof_stream << "* adjacency " << p.second << " maps to " << t.second << " in G^3 so using path " << path_from_p_to_q_1.second << " -- " << path_from_p_to_q_2.second << ", " << q.second << " maps to one of...\n";

    if (_imp->recover_encoding) {
        recover_adjacency_lines(0, p.first, path_from_p_to_q_1.first, t.first);
        for (auto & u : d1_from_t)
            recover_adjacency_lines(0, path_from_p_to_q_1.first, path_from_p_to_q_2.first, u.first);
        for (auto & u : d2_from_t)
            recover_adjacency_lines(0, path_from_p_to_q_2.first, q.first, u.first);
    }

    *_imp->proof_stream << "# 1\n";

    *_imp->proof_stream << "p";

    // if p maps to t then the first thing on the path from p to q has to go to one of...
    *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{0, p.first, path_from_p_to_q_1.first, t.first}]);
    // so the second thing on the path from p to q has to go to one of...
    for (auto & u : d1_from_t)
        *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{0, path_from_p_to_q_1.first, path_from_p_to_q_2.first, u.first}]) << " +";

    *_imp->proof_stream << " 0\n";
    ++_imp->proof_line;

    // tidy up
    *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
    for (auto & u : d2_from_t)
        *_imp->proof_stream << " 1 x" << _imp->variable_mappings[pair{path_from_p_to_q_2.first, u.first}];
    *_imp->proof_stream << " >= 1 ; " << _imp->proof_line << '\n';
    ++_imp->proof_line;

    *_imp->proof_stream << "p " << _imp->proof_line;
    for (auto & u : d2_from_t)
        *_imp->proof_stream << " " << get<1>(_imp->adjacency_lines[tuple{0, path_from_p_to_q_2.first, q.first, u.first}]) << " s +";
    *_imp->proof_stream << " 0\n";
    ++_imp->proof_line;

    *_imp->proof_stream << "# 0\n";

    *_imp->proof_stream << "ia 1 ~x" << _imp->variable_mappings[pair{p.first, t.first}];
    for (auto & u : d3_from_t)
        *_imp->proof_stream << " 1 x" << _imp->variable_mappings[pair{q.first, u.first}];
    *_imp->proof_stream << " >= 1 ; " << _imp->proof_line << '\n';
    ++_imp->proof_line;

    _imp->adjacency_lines.emplace(tuple{g, p.first, q.first, t.first}, tuple{_imp->proof_line, _imp->proof_line, ""});
}